

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svwaitdown.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int __fd;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  tai local_78;
  tai now;
  tai start;
  unsigned_long pid;
  char local_58 [4];
  int r;
  char status [20];
  int fd;
  int wdir;
  int dokill;
  int doexit;
  int verbose;
  unsigned_long sec;
  char **ppcStack_18;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _doexit = 600;
  bVar1 = false;
  wdir = 0;
  bVar2 = false;
  progname = *argv;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while (sec._4_4_ = sgetoptmine((int)argv_local,ppcStack_18,"t:xkvV"), sec._4_4_ != subgetoptdone)
  {
    switch(sec._4_4_) {
    case 0x56:
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    case 0x3f:
      usage();
      break;
    case 0x6b:
      bVar2 = true;
      break;
    case 0x74:
      scan_ulong(subgetoptarg,(unsigned_long *)&doexit);
      if ((_doexit == 0) || (6000 < _doexit)) {
        usage();
      }
      break;
    case 0x76:
      bVar1 = true;
      break;
    case 0x78:
      wdir = 1;
    }
  }
  ppcStack_18 = ppcStack_18 + subgetoptind;
  if ((ppcStack_18 == (char **)0x0) || (*ppcStack_18 == (char *)0x0)) {
    usage();
  }
  __fd = open_read(".");
  if (__fd == -1) {
    fatal("unable to open current working directory");
  }
  for (dir = ppcStack_18; *dir != (char *)0x0; dir = dir + 1) {
    if ((dir != ppcStack_18) && (iVar3 = fchdir(__fd), iVar3 == -1)) {
      fatal("unable to switch to starting directory");
    }
    iVar3 = chdir(*dir);
    if ((iVar3 != -1) && (iVar3 = open_write("supervise/control"), iVar3 != -1)) {
      sVar5 = write(iVar3,"dx",(long)(wdir + 1));
      if (sVar5 == wdir + 1) {
        close(iVar3);
      }
      else {
        close(iVar3);
      }
    }
  }
  dir = ppcStack_18;
  tai_now(&now);
LAB_0010250b:
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (*dir == (char *)0x0) {
              iVar3 = fchdir(__fd);
              if (iVar3 == -1) {
                strerr_warn("svwaitdown: warning: ","unable to switch to starting directory: ",
                            (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
              }
              close(__fd);
              if (100 < rc) {
                rc = 100;
              }
              _exit(rc);
            }
            iVar3 = fchdir(__fd);
            if (iVar3 == -1) {
              fatal("unable to switch to starting directory");
            }
            iVar3 = chdir(*dir);
            if (iVar3 != -1) break;
            warn(*dir,": unable to change directory: ",&strerr_sys);
          }
          iVar3 = open_write("supervise/ok");
          if (iVar3 != -1) break;
          piVar6 = __errno_location();
          if (*piVar6 == error_nodevice) {
            if (bVar1) {
              strerr_warn("svwaitdown: ",*dir,": runsv not running.",(char *)0x0,(char *)0x0,
                          (char *)0x0,(strerr *)0x0);
            }
            dir = dir + 1;
          }
          else {
            warn(*dir,": unable to open supervise/ok: ",&strerr_sys);
          }
        }
        close(iVar3);
        iVar3 = open_read("supervise/status");
        if (iVar3 != -1) break;
        warn(*dir,"unable to open supervise/status: ",&strerr_sys);
      }
      iVar4 = buffer_unixread(iVar3,local_58,0x14);
      close(iVar3);
      if ((0x11 < iVar4) && (iVar4 != 0x13)) break;
      if (iVar4 == -1) {
        warn(*dir,"unable to read supervise/status: ",&strerr_sys);
      }
      else {
        warn(*dir,": unable to read supervise/status: bad format.",(strerr *)0x0);
      }
    }
    if ((wdir != 0) ||
       ((ulong)(byte)status[4] +
        ((ulong)(byte)status[5] + ((ulong)(byte)status[6] + (ulong)(byte)status[7] * 0x100) * 0x100)
        * 0x100 != 0)) break;
    if (bVar1) {
      strerr_warn("svwaitdown: ",*dir,": down.",(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0);
    }
    dir = dir + 1;
  }
  if (status[9] != 'd') {
    iVar3 = open_write("supervise/control");
    if (iVar3 == -1) {
      warn(*dir,": unable to open supervise/control: ",&strerr_sys);
      goto LAB_0010250b;
    }
    sVar5 = write(iVar3,"dx",(long)(wdir + 1));
    if (sVar5 != wdir + 1) {
      warn(*dir,": unable to write to supervise/control: ",&strerr_sys);
      close(iVar3);
      goto LAB_0010250b;
    }
    close(iVar3);
  }
  tai_now(&local_78);
  tai_sub(&local_78,&local_78,&now);
  auVar7._8_4_ = (int)(local_78.x >> 0x20);
  auVar7._0_8_ = local_78.x;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(_doexit >> 0x20);
  auVar8._0_8_ = _doexit;
  auVar8._12_4_ = 0x45300000;
  if ((auVar7._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)local_78.x) - 4503599627370496.0) <
      (auVar8._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)_doexit) - 4503599627370496.0)) {
    sleep(1);
  }
  else {
    if (bVar1) {
      strerr_warn("svwaitdown: ","timeout.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                  (strerr *)0x0);
    }
    if (!bVar2) {
      _exit(0x6f);
    }
    iVar3 = chdir(*dir);
    if (iVar3 == -1) {
      warn(*dir,": unable to change directory: ",&strerr_sys);
    }
    else {
      iVar3 = open_write("supervise/control");
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        if (*piVar6 == error_nodevice) {
          if (bVar1) {
            strerr_warn("svwaitdown: ",*dir,": runsv not running.",(char *)0x0,(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
          }
          dir = dir + 1;
        }
        else {
          warn(*ppcStack_18,": unable to open supervise/control: ",&strerr_sys);
        }
      }
      else {
        sVar5 = write(iVar3,"k",1);
        if (sVar5 == 1) {
          strerr_warn("svwaitdown: ",*dir,": killed.",(char *)0x0,(char *)0x0,(char *)0x0,
                      (strerr *)0x0);
        }
        else {
          warn(*ppcStack_18,": unable to write to supervise/control: ",&strerr_sys);
        }
        close(iVar3);
        dir = dir + 1;
        if (*dir == (char *)0x0) {
          _exit(0x6f);
        }
      }
    }
  }
  goto LAB_0010250b;
}

Assistant:

int main(int argc, const char * const *argv) {
  int opt;
  unsigned long sec =600;
  int verbose =0;
  int doexit =0;
  int dokill =0;
  int wdir;
  int fd;
  char status[20];
  int r;
  unsigned long pid;
  struct tai start;
  struct tai now;

  progname =*argv;

  while ((opt =getopt(argc, argv, "t:xkvV")) != opteof) {
    switch(opt) {
    case 't':
      scan_ulong(optarg, &sec);
      if ((sec < 1) || (sec > 6000)) usage();
      break;
    case 'x':
      doexit =1;
      break;
    case 'k':
      dokill =1;
      break;
    case 'v':
      verbose =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");

  for (dir =argv; *dir; ++dir) {
    if (dir != argv)
      if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) continue; /* bummer */
    if ((fd =open_write("supervise/control")) == -1) continue; /* bummer */
    if (write(fd, "dx", 1 +doexit) != (1 +doexit)) {
      close(fd); continue; /* bummer */
    }
    close(fd);
  }
  dir =argv;

  tai_now(&start);
  while (*dir) {
    if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) {
      warn(*dir, ": unable to change directory: ", &strerr_sys);
      continue;
    }
    if ((fd =open_write("supervise/ok")) == -1) {
      if (errno == error_nodevice) {
        if (verbose) strerr_warn3(INFO, *dir, ": runsv not running.", 0);
        dir++;
      }
      else
        warn(*dir, ": unable to open supervise/ok: ", &strerr_sys);
      continue;
    }
    close(fd);

    if ((fd =open_read("supervise/status")) == -1) {
      warn(*dir, "unable to open supervise/status: ", &strerr_sys);
      continue;
    }
    r =buffer_unixread(fd, status, 20);
    close(fd);
    if ((r < 18) || (r == 19)) { /* supervise compatibility */
      if (r == -1)
        warn(*dir, "unable to read supervise/status: ", &strerr_sys);
      else
        warn(*dir, ": unable to read supervise/status: bad format.", 0);
      continue;
    }
    pid =(unsigned char)status[15];
    pid <<=8; pid +=(unsigned char)status[14];
    pid <<=8; pid +=(unsigned char)status[13];
    pid <<=8; pid +=(unsigned char)status[12];

    if (! doexit && ! pid) {
      /* ok, service is down */
      if (verbose) strerr_warn3(INFO, *dir, ": down.", 0);
      dir++;
      continue;
    }

    if (status[17] != 'd') { /* catch previous failures */
      if ((fd =open_write("supervise/control")) == -1) {
        warn(*dir, ": unable to open supervise/control: ", &strerr_sys);
        continue;
      }
      if (write(fd, "dx", 1 +doexit) != (1 +doexit)) {
        warn(*dir, ": unable to write to supervise/control: ", &strerr_sys);
        close(fd);
        continue;
      }
      close(fd);
    }

    tai_now(&now);
    tai_sub(&now, &now, &start);
    if (tai_approx(&now) >= sec) {
      /* timeout */
      if (verbose) strerr_warn2(INFO, "timeout.", 0);
      if (dokill) {
        if (chdir(*dir) == -1) {
          warn(*dir, ": unable to change directory: ", &strerr_sys);
          continue;
        }
        if ((fd =open_write("supervise/control")) == -1) {
          if (errno == error_nodevice) {
            if (verbose)
              strerr_warn3(INFO, *dir, ": runsv not running.", 0);
            dir++;
          }
          else
            warn(*argv, ": unable to open supervise/control: ", &strerr_sys);
          continue;
        }
        if (write(fd, "k", 1) != 1)
          warn(*argv, ": unable to write to supervise/control: ", &strerr_sys);
        else
          strerr_warn3(INFO, *dir, ": killed.", 0);
        close(fd);
        dir++;
        if (! *dir) _exit(111);
        continue;
      }
      _exit(111);
    }
    sleep(1);
  }
  if (fchdir(wdir) == -1)
    strerr_warn2(WARN, "unable to switch to starting directory: ", &strerr_sys);
  close(wdir);
  if (rc > 100) rc =100;
  _exit(rc);
}